

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O2

int __thiscall QBspTree::init(QBspTree *this,EVP_PKEY_CTX *ctx)

{
  QPoint QVar1;
  pointer pNVar2;
  int *piVar3;
  Type in_ECX;
  uint in_EDX;
  Representation RVar4;
  Type TVar5;
  int in_R8D;
  Representation RVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  Representation local_48;
  Representation RStack_44;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TVar5 = (in_EDX & 1) + VerticalPlane;
  if (in_ECX != Both) {
    TVar5 = in_ECX;
  }
  QVar1 = QRect::center((QRect *)ctx);
  RVar6 = QVar1.xp.m_i;
  RVar4 = QVar1.yp.m_i;
  RVar7.m_i = RVar4.m_i;
  if (TVar5 == VerticalPlane) {
    RVar7.m_i = RVar6.m_i;
  }
  pNVar2 = QList<QBspTree::Node>::data(&this->nodes);
  pNVar2[in_R8D].pos = RVar7.m_i;
  pNVar2 = QList<QBspTree::Node>::data(&this->nodes);
  pNVar2[in_R8D].type = TVar5;
  uStack_40 = *(undefined8 *)(ctx + 8);
  local_58 = *(undefined4 *)ctx;
  uStack_54 = *(undefined4 *)(ctx + 4);
  iStack_50 = *(int *)(ctx + 8);
  iStack_4c = *(int *)(ctx + 0xc);
  if (TVar5 == VerticalPlane) {
    piVar3 = &iStack_50;
    _local_48 = CONCAT44((int)((ulong)*(undefined8 *)ctx >> 0x20),RVar6.m_i);
    RVar4.m_i = RVar6.m_i;
  }
  else {
    piVar3 = &iStack_4c;
    _local_48 = CONCAT44(RVar4.m_i,(int)*(undefined8 *)ctx);
  }
  *piVar3 = RVar4.m_i + -1;
  if (in_EDX != 1) {
    init(this,(EVP_PKEY_CTX *)&local_58);
    init(this,(EVP_PKEY_CTX *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QBspTree::init(const QRect &area, int depth, NodeType type, int index)
{
    Node::Type t = Node::None; // t should never have this value
    if (type == Node::Both) // if both planes are specified, use 2d bsp
        t = (depth & 1) ? Node::HorizontalPlane : Node::VerticalPlane;
    else
        t = type;
    QPoint center = area.center();
    nodes[index].pos = (t == Node::VerticalPlane ? center.x() : center.y());
    nodes[index].type = t;

    QRect front = area;
    QRect back = area;

    if (t == Node::VerticalPlane) {
        front.setLeft(center.x());
        back.setRight(center.x() - 1); // front includes the center
    } else { // t == Node::HorizontalPlane
        front.setTop(center.y());
        back.setBottom(center.y() - 1);
    }

    int idx = firstChildIndex(index);
    if (--depth) {
        init(back, depth, type, idx);
        init(front, depth, type, idx + 1);
    }
}